

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O3

bool tinyusdz::prim::anon_unknown_0::ReconstructCollectionProperties
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *table,map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                       *properties,Collection *coll,string *warn,string *err,
               bool strict_allowedToken_check)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint uVar3;
  _Base_ptr p_Var4;
  pointer pcVar5;
  _Base_ptr __n;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  undefined1 uVar9;
  PrimVar *this;
  int iVar10;
  const_iterator cVar11;
  ulong uVar12;
  CollectionInstance *pCVar13;
  _Rb_tree_node_base *p_Var14;
  long *plVar15;
  ostream *poVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar17;
  Attribute *args;
  void *pvVar18;
  long lVar19;
  _Rb_tree_node_base *p_Var20;
  _Rb_tree_header *p_Var21;
  char *pcVar22;
  undefined8 uVar23;
  _Alloc_hider _Var24;
  undefined7 in_register_00000089;
  bool bVar25;
  string *psVar26;
  char cVar27;
  bool bVar28;
  Animatable<bool> animatable_value;
  Attribute *attr;
  ParseResult ret;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  stringstream ss;
  string attr_type_name;
  function<nonstd::expected_lite::expected<tinyusdz::CollectionInstance::ExpansionRule,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ExpansionRuleEnumHandler;
  string instance_name;
  string suffix;
  ostringstream ss_e;
  undefined1 local_658 [55];
  fmt local_621;
  _Rb_tree_node_base *local_620;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_618;
  string *local_610;
  undefined1 local_608 [32];
  bool bStack_5e8;
  Attribute *local_5e0;
  uint local_5d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d0;
  string *local_5b0;
  ordered_dict<tinyusdz::CollectionInstance> *local_5a8;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *local_5a0;
  _Base_ptr local_598;
  undefined4 local_58c;
  string local_588;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_568;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  undefined1 local_528 [10];
  undefined6 uStack_51e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_518;
  bool bStack_508;
  undefined7 uStack_507;
  undefined1 local_500;
  ios_base local_4b8 [16];
  ios_base local_4a8 [272];
  string local_398;
  undefined8 local_378;
  undefined8 uStack_370;
  code *local_368;
  code *local_360;
  undefined1 local_358 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_338;
  code *local_328;
  undefined8 uStack_320;
  PrimVar *local_310;
  Attribute *local_308;
  _Rb_tree_node_base *local_300;
  string local_2f8;
  long *local_2d8 [2];
  long local_2c8 [2];
  undefined1 local_2b8 [32];
  storage_t<tinyusdz::value::StringData> local_298;
  bool local_268;
  undefined1 local_260 [48];
  bool local_230;
  storage_t<double> local_228;
  bool local_220;
  storage_t<tinyusdz::Token> local_218;
  bool local_1f8;
  storage_t<tinyusdz::Token> local_1f0;
  bool local_1d0;
  storage_t<tinyusdz::Token> local_1c8;
  bool local_1a8;
  storage_t<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
  local_1a0;
  bool local_170;
  storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_168;
  bool local_148;
  storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_140;
  bool local_120;
  storage_t<tinyusdz::Token> local_118;
  _Rb_tree_node_base local_f0;
  size_t local_d0;
  pointer pSStack_c8;
  pointer local_c0;
  pointer pSStack_b8;
  undefined1 auStack_b0 [24];
  optional<tinyusdz::Animatable<bool>> aoStack_98 [4];
  storage_t<tinyusdz::CollectionInstance::ExpansionRule> local_94;
  storage_t<tinyusdz::Animatable<bool>_> local_90;
  bool local_68;
  pointer local_58;
  pointer local_48;
  bool local_38;
  
  local_378 = 0;
  uStack_370 = 0;
  local_360 = ::std::
              _Function_handler<nonstd::expected_lite::expected<tinyusdz::CollectionInstance::ExpansionRule,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc:2642:131)>
              ::_M_invoke;
  local_368 = ::std::
              _Function_handler<nonstd::expected_lite::expected<tinyusdz::CollectionInstance::ExpansionRule,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc:2642:131)>
              ::_M_manager;
  local_618 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
               *)table;
  if (coll == (Collection *)0x0) {
    bVar28 = false;
  }
  else {
    p_Var14 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var21 = &(properties->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var14 == p_Var21) {
      bVar28 = true;
    }
    else {
      local_58c = (undefined4)CONCAT71(in_register_00000089,strict_allowedToken_check);
      local_598 = (_Base_ptr)&(table->_M_t)._M_impl.super__Rb_tree_header;
      local_5a0 = (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)auStack_b0;
      local_610 = err;
      local_5b0 = warn;
      local_5a8 = &coll->_instances;
      local_300 = &p_Var21->_M_header;
      do {
        p_Var20 = p_Var14 + 1;
        local_2b8._0_8_ = (long)local_2b8 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"collection:","");
        uVar23 = local_2b8._0_8_;
        p_Var4 = (_Base_ptr)CONCAT44(local_2b8._12_4_,local_2b8._8_4_);
        if (p_Var14[1]._M_parent < p_Var4) {
          bVar28 = false;
        }
        else if (p_Var4 == (_Base_ptr)0x0) {
          bVar28 = true;
        }
        else {
          iVar10 = bcmp((void *)local_2b8._0_8_,*(void **)p_Var20,(size_t)p_Var4);
          bVar28 = iVar10 == 0;
        }
        if (uVar23 != (long)local_2b8 + 0x10) {
          operator_delete((void *)uVar23,CONCAT62(local_2b8._18_6_,local_2b8._16_2_) + 1);
        }
        if ((bVar28) &&
           (cVar11 = ::std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_618,(key_type *)p_Var20), cVar11._M_node == local_598)) {
          local_2b8._0_8_ = (long)local_2b8 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"collection:","");
          p_Var4 = p_Var14[1]._M_parent;
          __n = (_Base_ptr)CONCAT44(local_2b8._12_4_,local_2b8._8_4_);
          local_620 = p_Var20;
          if (p_Var4 < __n) {
            pvVar18 = *(void **)p_Var20;
LAB_00225739:
            local_2d8[0] = local_2c8;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)local_2d8,pvVar18,(long)&p_Var4->_M_color + (long)pvVar18);
          }
          else {
            if (__n != (_Base_ptr)0x0) {
              pvVar18 = *(void **)p_Var20;
              iVar10 = bcmp((void *)local_2b8._0_8_,pvVar18,(size_t)__n);
              if (iVar10 != 0) goto LAB_00225739;
            }
            ::std::__cxx11::string::substr((ulong)local_2d8,(ulong)local_620);
          }
          if (local_2b8._0_8_ != (long)local_2b8 + 0x10) {
            operator_delete((void *)local_2b8._0_8_,CONCAT62(local_2b8._18_6_,local_2b8._16_2_) + 1)
            ;
          }
          local_528._0_8_ = &aStack_518;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_528,":","");
          local_568.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_568.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_568.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          lVar19 = 0x147ae15;
          uVar12 = 0;
          do {
            uVar12 = ::std::__cxx11::string::find_first_not_of
                               ((char *)local_2d8,local_528._0_8_,uVar12);
            if (uVar12 == 0xffffffffffffffff) break;
            uVar12 = ::std::__cxx11::string::find((char *)local_2d8,local_528._0_8_,uVar12);
            ::std::__cxx11::string::substr((ulong)local_2b8,(ulong)local_2d8);
            ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_568,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2b8);
            if (local_2b8._0_8_ != (long)local_2b8 + 0x10) {
              operator_delete((void *)local_2b8._0_8_,
                              CONCAT62(local_2b8._18_6_,local_2b8._16_2_) + 1);
            }
            lVar19 = lVar19 + -1;
          } while (lVar19 != 0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_528._0_8_ != &aStack_518) {
            operator_delete((void *)local_528._0_8_,
                            CONCAT44(aStack_518._M_allocated_capacity._4_4_,
                                     aStack_518._M_allocated_capacity._0_4_) + 1);
          }
          psVar26 = local_610;
          pbVar17 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((long)local_568.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_568.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
          if (pbVar17 ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000040) {
            if ((local_568.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_string_length == 0) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2b8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2b8,"ReconstructCollectionProperties",0x1f);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b8,"():",3);
              poVar16 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2b8,0xa6d);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
              lVar19 = 0x33;
              pcVar22 = "INSTANCE_NAME is empty for collection property name";
LAB_00225c96:
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2b8,pcVar22,lVar19);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b8,"\n",1);
              if (psVar26 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                ::std::__cxx11::stringbuf::str();
                plVar15 = (long *)::std::__cxx11::string::_M_append
                                            (local_658,(ulong)(psVar26->_M_dataplus)._M_p);
                goto LAB_00225ce7;
              }
              goto LAB_00225d7c;
            }
            if (local_568.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length == 0) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2b8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2b8,"ReconstructCollectionProperties",0x1f);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b8,"():",3);
              poVar16 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2b8,0xa70);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
              lVar19 = 0x21;
              pcVar22 = "Collection property name is empty";
              goto LAB_00225c96;
            }
            pbVar17 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_358 + 0x10);
            pcVar5 = ((local_568.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
            local_358._0_8_ = pbVar17;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)local_358,pcVar5,
                       pcVar5 + (local_568.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
            iVar10 = ::std::__cxx11::string::compare
                               ((char *)(local_568.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + 1));
            p_Var20 = local_620;
            if (iVar10 == 0) {
              if (((ulong)p_Var14[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
                pCVar13 = ordered_dict<tinyusdz::CollectionInstance>::get_or_add
                                    (local_5a8,(string *)local_358);
                nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=
                          (&pCVar13->includes,(Relationship *)&p_Var14[0x17]._M_left);
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          (local_618,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           p_Var20);
                cVar27 = '\0';
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b8);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2b8,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2b8,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b8,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2b8,"ReconstructCollectionProperties",0x1f);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b8,"():",3);
                poVar16 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2b8,0xa78);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
                local_658._0_8_ = local_658 + 0x10;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_658,"`{}` must be a Relationship","");
                fmt::format<std::__cxx11::string>
                          ((string *)local_528,(fmt *)local_658,(string *)p_Var20,pbVar17);
                poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_2b8,(char *)local_528._0_8_,
                                     stack0xfffffffffffffae0);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_528._0_8_ != &aStack_518) {
                  operator_delete((void *)local_528._0_8_,
                                  CONCAT44(aStack_518._M_allocated_capacity._4_4_,
                                           aStack_518._M_allocated_capacity._0_4_) + 1);
                }
                if ((undefined1 *)local_658._0_8_ != local_658 + 0x10) {
                  operator_delete((void *)local_658._0_8_,
                                  CONCAT26(local_658._22_2_,
                                           CONCAT15(local_658[0x15],
                                                    CONCAT14(local_658[0x14],local_658._16_4_))) + 1
                                 );
                }
                if (psVar26 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  plVar15 = (long *)::std::__cxx11::string::_M_append
                                              (local_658,(ulong)(psVar26->_M_dataplus)._M_p);
                  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)(plVar15 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar15 == paVar1) {
                    aStack_518._M_allocated_capacity._0_4_ =
                         (undefined4)paVar1->_M_allocated_capacity;
                    aStack_518._M_allocated_capacity._4_4_ =
                         (undefined4)(paVar1->_M_allocated_capacity >> 0x20);
                    aStack_518._M_local_buf[8] = (char)plVar15[3];
                    aStack_518._9_7_ = (undefined7)((ulong)plVar15[3] >> 8);
                    local_528._0_8_ = &aStack_518;
                  }
                  else {
                    aStack_518._M_allocated_capacity._0_4_ =
                         (undefined4)paVar1->_M_allocated_capacity;
                    aStack_518._M_allocated_capacity._4_4_ =
                         (undefined4)(paVar1->_M_allocated_capacity >> 0x20);
                    local_528._0_8_ =
                         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)*plVar15;
                  }
                  unique0x00012000 = plVar15[1];
                  *plVar15 = (long)paVar1;
                  plVar15[1] = 0;
                  *(undefined1 *)(plVar15 + 2) = 0;
                  ::std::__cxx11::string::operator=((string *)psVar26,(string *)local_528);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_528._0_8_ != &aStack_518) {
LAB_00226729:
                    operator_delete((void *)local_528._0_8_,
                                    CONCAT44(aStack_518._M_allocated_capacity._4_4_,
                                             aStack_518._M_allocated_capacity._0_4_) + 1);
                  }
LAB_00226739:
                  if ((undefined1 *)local_658._0_8_ != local_658 + 0x10) {
                    operator_delete((void *)local_658._0_8_,
                                    CONCAT26(local_658._22_2_,
                                             CONCAT15(local_658[0x15],
                                                      CONCAT14(local_658[0x14],local_658._16_4_))) +
                                    1);
                  }
                }
LAB_00226755:
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b8);
                ::std::ios_base::~ios_base((ios_base *)(local_260 + 0x18));
                cVar27 = '\x01';
              }
            }
            else {
              iVar10 = ::std::__cxx11::string::compare
                                 ((char *)(local_568.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start + 1));
              p_Var20 = local_620;
              if (iVar10 == 0) {
                local_2b8._0_8_ = ((ulong)local_2b8._0_8_ >> 8 & 0xffffff) << 8;
                local_2b8._8_4_ = local_2b8._8_4_ & 0xffffff00;
                local_2b8._12_4_ = (storage_t<unsigned_int>)0x0;
                local_2b8._16_2_ = 0;
                local_2b8[0x18] = '\0';
                local_228 = (storage_t<double>)0x0;
                local_220 = false;
                local_118._16_8_ = 0;
                local_118._24_8_ = 0;
                local_118.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
                local_118._8_8_ = 0;
                local_f0._M_color = _S_red;
                local_f0._M_parent = (_Base_ptr)0x0;
                local_268 = false;
                local_298._32_8_ = 0;
                local_298._40_8_ = 0;
                local_298._16_8_ = 0;
                local_298._24_8_ = 0;
                local_298.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
                local_298._8_8_ = 0;
                local_230 = false;
                local_260._32_8_ = 0;
                local_260._40_8_ = 0;
                local_260._16_8_ = 0;
                local_260._24_8_ = 0;
                local_260._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
                local_260._8_8_ = 0;
                local_1f8 = false;
                local_218._16_8_ = 0;
                local_218._24_8_ = 0;
                local_218.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
                local_218._8_8_ = 0;
                local_1d0 = false;
                local_1f0._16_8_ = 0;
                local_1f0._24_8_ = 0;
                local_1f0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
                local_1f0._8_8_ = 0;
                local_1a8 = false;
                local_1c8._16_8_ = 0;
                local_1c8._24_8_ = 0;
                local_1c8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
                local_1c8._8_8_ = 0;
                local_170 = false;
                local_1a0._32_8_ = 0;
                local_1a0._40_8_ = 0;
                local_1a0._16_8_ = 0;
                local_1a0._24_8_ = 0;
                local_1a0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
                local_1a0._8_8_ = 0;
                local_148 = false;
                local_168._16_8_ = 0;
                local_168._24_8_ = 0;
                local_168.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
                local_168._8_8_ = 0;
                local_120 = false;
                local_140._16_8_ = 0;
                local_140._24_8_ = 0;
                local_140.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
                local_140._8_8_ = 0;
                local_f0._M_left = &local_f0;
                local_94 = (storage_t<tinyusdz::CollectionInstance::ExpansionRule>)0x0;
                local_90._0_1_ = 0;
                auStack_b0[0x10] = 0;
                stack0xffffffffffffff61 = 0;
                auStack_b0._0_8_ = (pointer)0x0;
                auStack_b0[8] = 0;
                auStack_b0._9_7_ = 0;
                local_c0 = (pointer)0x0;
                pSStack_b8 = (pointer)0x0;
                local_d0 = 0;
                pSStack_c8 = (pointer)0x0;
                local_90._4_4_ = 0;
                local_90._8_1_ = 0;
                local_f0._M_right = local_f0._M_left;
                cVar11 = ::std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_618,(key_type *)local_620);
                cVar27 = '\x03';
                if (cVar11._M_node == local_598) {
                  local_5e0 = (Attribute *)(p_Var14 + 2);
                  if (((ulong)p_Var14[0x17]._M_parent & 0xfffffffe00000000) != 0x200000000) {
                    Attribute::type_name_abi_cxx11_((string *)local_528,local_5e0);
                    local_658._0_8_ = local_658 + 0x10;
                    local_658[0x14] = 'n';
                    local_658._16_4_ = 0x656b6f74;
                    local_658._8_8_ = (anon_struct_8_0_00000001_for___align)0x5;
                    local_658[0x15] = '\0';
                    if ((((pointer)stack0xfffffffffffffae0 == (pointer)0x5) &&
                        (*(char *)(local_528._0_8_ + 4) == 'n' &&
                         *(int *)local_528._0_8_ == 0x656b6f74)) &&
                       (uVar3 = *(uint *)((long)&p_Var14[0x17]._M_parent + 4), uVar3 < 2)) {
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_528._0_8_ != &aStack_518) {
                        operator_delete((void *)local_528._0_8_,
                                        CONCAT44(aStack_518._M_allocated_capacity._4_4_,
                                                 aStack_518._M_allocated_capacity._0_4_) + 1);
                      }
                      if (uVar3 == 0) {
                        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_528);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_528,"[warn]",6);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_528,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                   ,0x5a);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_528,":",1);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_528,"ReconstructCollectionProperties",0x1f);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_528,"():",3);
                        poVar16 = (ostream *)
                                  ::std::ostream::operator<<((ostringstream *)local_528,0xa84);
                        ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_528,"No value assigned to `",0x16);
                        poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)local_528,*(char **)(p_Var14 + 1),
                                             (long)p_Var14[1]._M_parent);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar16,"` token attribute. Set default token value.",0x2b);
                        psVar26 = local_610;
                        ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
                        if (local_5b0 != (string *)0x0) {
                          ::std::__cxx11::stringbuf::str();
                          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_658,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_608,psVar26);
                          ::std::__cxx11::string::operator=((string *)local_5b0,(string *)local_658)
                          ;
                          if ((undefined1 *)local_658._0_8_ != local_658 + 0x10) {
                            operator_delete((void *)local_658._0_8_,
                                            CONCAT26(local_658._22_2_,
                                                     CONCAT15(local_658[0x15],
                                                              CONCAT14(local_658[0x14],
                                                                       local_658._16_4_))) + 1);
                          }
                          if ((undefined1 *)local_608._0_8_ != local_608 + 0x10) {
                            operator_delete((void *)local_608._0_8_,
                                            CONCAT44(local_608._20_4_,local_608._16_4_) + 1);
                          }
                        }
                        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_528);
                        ::std::ios_base::~ios_base(local_4b8);
                        AttrMetas::operator=((AttrMetas *)local_2b8,(AttrMetas *)(p_Var14 + 7));
                        ::std::
                        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        ::_M_insert_unique<std::__cxx11::string_const&>
                                  (local_618,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)p_Var20);
                        goto LAB_0022743f;
                      }
                    }
                    else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)local_528._0_8_ != &aStack_518) {
                      operator_delete((void *)local_528._0_8_,
                                      CONCAT44(aStack_518._M_allocated_capacity._4_4_,
                                               aStack_518._M_allocated_capacity._0_4_) + 1);
                    }
                  }
                  aStack_518._M_allocated_capacity._0_4_ = 0;
                  aStack_518._M_allocated_capacity._4_4_ = 0;
                  aStack_518._M_local_buf[8] = '\0';
                  aStack_518._9_7_ = 0;
                  local_528._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0;
                  stack0xfffffffffffffae0 = (pointer)0x0;
                  if (local_368 == (code *)0x0) {
                    local_328 = (code *)0x0;
                    uStack_320 = 0;
                    local_338._M_allocated_capacity = 0;
                    local_338._8_8_ = 0;
                  }
                  else {
                    (*local_368)(local_528,&local_378,2);
                    aStack_518._M_local_buf[8] = (char)local_360;
                    aStack_518._9_7_ = (undefined7)((ulong)local_360 >> 8);
                    aStack_518._M_allocated_capacity._0_4_ = SUB84(local_368,0);
                    aStack_518._M_allocated_capacity._4_4_ = (undefined4)((ulong)local_368 >> 0x20);
                    local_338._M_allocated_capacity = 0;
                    local_338._8_8_ = 0;
                    local_328 = (code *)0x0;
                    uStack_320 = 0;
                    if (local_368 != (code *)0x0) {
                      (*local_368)(&local_338,local_528,2);
                      local_328 = (code *)CONCAT44(aStack_518._M_allocated_capacity._4_4_,
                                                   aStack_518._M_allocated_capacity._0_4_);
                      uStack_320 = CONCAT71(aStack_518._9_7_,aStack_518._M_local_buf[8]);
                    }
                  }
                  err = (string *)local_2b8;
                  bVar28 = ParseUniformEnumProperty<tinyusdz::CollectionInstance::ExpansionRule,tinyusdz::CollectionInstance::ExpansionRule>
                                     ((string *)p_Var20,local_58c._0_1_,
                                      (EnumHandlerFun<tinyusdz::CollectionInstance::ExpansionRule> *
                                      )&local_338,local_5e0,
                                      (TypedAttributeWithFallback<tinyusdz::CollectionInstance::ExpansionRule>
                                       *)err,local_5b0,psVar26);
                  if (local_328 != (code *)0x0) {
                    (*local_328)((_Any_data *)&local_338,(_Any_data *)&local_338,__destroy_functor);
                  }
                  cVar27 = '\x01';
                  if (bVar28) {
                    AttrMetas::operator=((AttrMetas *)local_2b8,(AttrMetas *)(p_Var14 + 7));
                    ::std::
                    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    ::_M_insert_unique<std::__cxx11::string_const&>
                              (local_618,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               p_Var20);
                    cVar27 = '\x03';
                  }
                  if ((code *)CONCAT44(aStack_518._M_allocated_capacity._4_4_,
                                       aStack_518._M_allocated_capacity._0_4_) != (code *)0x0) {
                    (*(code *)CONCAT44(aStack_518._M_allocated_capacity._4_4_,
                                       aStack_518._M_allocated_capacity._0_4_))
                              (local_528,local_528,3);
                  }
                }
              }
              else {
                iVar10 = ::std::__cxx11::string::compare
                                   ((char *)(local_568.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start + 1));
                if (iVar10 != 0) {
                  iVar10 = ::std::__cxx11::string::compare
                                     ((char *)(local_568.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start + 1));
                  cVar27 = '\0';
                  if (iVar10 == 0) {
                    if (((ulong)p_Var14[0x17]._M_parent & 0xfffffffe00000000) != 0x200000000) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b8);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2b8,"[error]",7);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2b8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                 ,0x5a);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2b8,":",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2b8,"ReconstructCollectionProperties",0x1f);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2b8,"():",3);
                      poVar16 = (ostream *)
                                ::std::ostream::operator<<((ostringstream *)local_2b8,0xa96);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
                      local_658._0_8_ = local_658 + 0x10;
                      ::std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_658,"`{}` must be a Relationship","");
                      fmt::format<std::__cxx11::string>
                                ((string *)local_528,(fmt *)local_658,(string *)p_Var20,pbVar17);
                      poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_2b8,(char *)local_528._0_8_,
                                           stack0xfffffffffffffae0);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_528._0_8_ != &aStack_518) {
                        operator_delete((void *)local_528._0_8_,
                                        CONCAT44(aStack_518._M_allocated_capacity._4_4_,
                                                 aStack_518._M_allocated_capacity._0_4_) + 1);
                      }
                      if ((undefined1 *)local_658._0_8_ != local_658 + 0x10) {
                        operator_delete((void *)local_658._0_8_,
                                        CONCAT26(local_658._22_2_,
                                                 CONCAT15(local_658[0x15],
                                                          CONCAT14(local_658[0x14],local_658._16_4_)
                                                         )) + 1);
                      }
                      if (psVar26 !=
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        ::std::__cxx11::stringbuf::str();
                        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_528,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_658,psVar26);
                        ::std::__cxx11::string::operator=((string *)psVar26,(string *)local_528);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_528._0_8_ != &aStack_518) goto LAB_00226729;
                        goto LAB_00226739;
                      }
                      goto LAB_00226755;
                    }
                    pCVar13 = ordered_dict<tinyusdz::CollectionInstance>::get_or_add
                                        (local_5a8,(string *)local_358);
                    nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=
                              (&pCVar13->excludes,(Relationship *)&p_Var14[0x17]._M_left);
                    ::std::
                    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    ::_M_insert_unique<std::__cxx11::string_const&>
                              (local_618,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               p_Var20);
                  }
                  goto LAB_00227459;
                }
                aStack_518._M_local_buf[8] = '\0';
                aStack_518._9_7_ = 0;
                bStack_508 = false;
                stack0xfffffffffffffae0 = (pointer)0x0;
                aStack_518._M_allocated_capacity._0_4_ = 0;
                aStack_518._M_allocated_capacity._4_4_ = 0;
                local_528._2_6_ = SUB86(local_528._0_8_,2) & 0xffffffffff00;
                local_528._0_2_ = 0x100;
                TypedAttributeWithFallback<tinyusdz::Animatable<bool>_>::TypedAttributeWithFallback
                          ((TypedAttributeWithFallback<tinyusdz::Animatable<bool>_> *)local_2b8,
                           (Animatable<bool> *)local_528);
                if ((pointer)stack0xfffffffffffffae0 != (pointer)0x0) {
                  operator_delete((void *)stack0xfffffffffffffae0,
                                  CONCAT71(aStack_518._9_7_,aStack_518._M_local_buf[8]) -
                                  stack0xfffffffffffffae0);
                }
                local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_2f8,*(long *)(p_Var14 + 1),
                           (long)&(p_Var14[1]._M_parent)->_M_color + *(long *)(p_Var14 + 1));
                p_Var20 = local_620;
                local_5d0._M_dataplus._M_p = (pointer)&local_5d0.field_2;
                local_5d0._M_string_length = 0;
                local_5d0.field_2._M_local_buf[0] = '\0';
                iVar10 = ::std::__cxx11::string::compare((string *)&local_2f8);
                if (iVar10 == 0) {
                  if (((ulong)p_Var14[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
                    local_5d8 = 7;
                    local_658._0_8_ = local_658 + 0x10;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_658,
                               "Property {} must be Attribute, but declared as Relationhip.","");
                    p_Var20 = local_620;
                    fmt::format<std::__cxx11::string>
                              ((string *)local_528,(fmt *)local_658,(string *)local_620,pbVar17);
                    ::std::__cxx11::string::operator=((string *)&local_5d0,(string *)local_528);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_528._0_8_ != &aStack_518) {
                      operator_delete((void *)local_528._0_8_,
                                      CONCAT44(aStack_518._M_allocated_capacity._4_4_,
                                               aStack_518._M_allocated_capacity._0_4_) + 1);
                    }
                    if ((undefined1 *)local_658._0_8_ == local_658 + 0x10) goto LAB_00227183;
                    uVar23 = CONCAT26(local_658._22_2_,
                                      CONCAT15(local_658[0x15],
                                               CONCAT14(local_658[0x14],local_658._16_4_)));
                    _Var24._M_p = (pointer)local_658._0_8_;
                  }
                  else {
                    Attribute::type_name_abi_cxx11_(&local_398,(Attribute *)(p_Var14 + 2));
                    aStack_518._M_allocated_capacity._0_4_ = 0x6c6f6f62;
                    stack0xfffffffffffffae0 = (pointer)0x4;
                    aStack_518._M_allocated_capacity._4_4_ =
                         aStack_518._M_allocated_capacity._4_4_ & 0xffffff00;
                    local_528._0_8_ = &aStack_518;
                    if (local_398._M_string_length == 4) {
                      if (*(int *)local_398._M_dataplus._M_p != 0x6c6f6f62) {
                        local_658._0_8_ = local_658 + 0x10;
                        local_658._16_4_ = 0x6c6f6f62;
                        local_658._8_8_ = (anon_struct_8_0_00000001_for___align)0x4;
                        local_658[0x14] = '\0';
                        if (*(int *)local_398._M_dataplus._M_p != 0x6c6f6f62) goto LAB_0022697d;
                      }
                      local_5e0 = (Attribute *)p_Var14[6]._M_parent;
                      args = (Attribute *)p_Var14[6]._M_left;
                      local_308 = args;
                      if (args != local_5e0) {
                        std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                                  (local_5a0,
                                   (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                                   &p_Var14[6]._M_parent);
                      }
                      iVar10 = *(int *)((long)&p_Var14[0x17]._M_parent + 4);
                      if (iVar10 == 1) {
                        if (p_Var14[5]._M_left == p_Var14[5]._M_parent) {
                          if (p_Var14[4]._M_right == (_Base_ptr)0x0) {
                            bVar28 = false;
                          }
                          else {
                            iVar10 = (**(code **)p_Var14[4]._M_right)();
                            bVar28 = iVar10 == 4;
                          }
                          if ((!bVar28) && ((p_Var14[5]._M_color & _S_black) == _S_red))
                          goto LAB_00226ba3;
                          local_38 = true;
LAB_00226cee:
                          local_608._0_8_ = local_608._0_8_ & 0xffffffffff000000;
                          local_608[0x18] = '\0';
                          local_608._25_7_ = 0;
                          bStack_5e8 = false;
                          local_608._8_8_ = (pointer)0x0;
                          local_608._16_4_ = 0;
                          local_608._20_4_ = 0;
                          local_310 = (PrimVar *)&p_Var14[4]._M_parent;
                          if (p_Var14[5]._M_left == p_Var14[5]._M_parent) {
                            bVar8 = false;
LAB_00226efc:
                            this = local_310;
                            bVar25 = bVar8;
                            if ((((char)p_Var14[5]._M_color == _S_red) &&
                                (p_Var14[4]._M_right != (_Base_ptr)0x0)) &&
                               ((iVar10 = (**(code **)p_Var14[4]._M_right)(), iVar10 == 0 ||
                                ((p_Var14[4]._M_right != (_Base_ptr)0x0 &&
                                 (iVar10 = (**(code **)p_Var14[4]._M_right)(), iVar10 == 1)))))) {
                              bVar6 = false;
                            }
                            else {
                              primvar::PrimVar::get_value<bool>((PrimVar *)local_528);
                              if ((string)local_528[0] != (string)0x1) {
                                local_5d8 = 8;
                                local_658._0_8_ = local_658 + 0x10;
                                ::std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)local_658,
                                           "Internal error. Invalid attribute value? get_value<{}> failed. Attribute has type {}"
                                           ,"");
                                local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
                                local_588.field_2._M_allocated_capacity._0_4_ = 0x6c6f6f62;
                                local_588._M_string_length = 4;
                                local_588.field_2._M_allocated_capacity._4_4_ =
                                     local_588.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
                                primvar::PrimVar::type_name_abi_cxx11_(&local_548,this);
                                fmt::format<std::__cxx11::string,std::__cxx11::string>
                                          ((string *)local_528,(fmt *)local_658,&local_588,
                                           &local_548,err);
                                ::std::__cxx11::string::operator=
                                          ((string *)&local_5d0,(string *)local_528);
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_528._0_8_ != &aStack_518) {
                                  operator_delete((void *)local_528._0_8_,
                                                  CONCAT44(aStack_518._M_allocated_capacity._4_4_,
                                                           aStack_518._M_allocated_capacity._0_4_) +
                                                  1);
                                }
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_548._M_dataplus._M_p != &local_548.field_2) {
                                  operator_delete(local_548._M_dataplus._M_p,
                                                  CONCAT44(local_548.field_2._M_allocated_capacity.
                                                           _4_4_,local_548.field_2.
                                                                 _M_allocated_capacity._0_4_) + 1);
                                }
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_588._M_dataplus._M_p != &local_588.field_2) {
                                  operator_delete(local_588._M_dataplus._M_p,
                                                  CONCAT44(local_588.field_2._M_allocated_capacity.
                                                           _4_4_,local_588.field_2.
                                                                 _M_allocated_capacity._0_4_) + 1);
                                }
                                if ((undefined1 *)local_658._0_8_ != local_658 + 0x10) {
                                  operator_delete((void *)local_658._0_8_,
                                                  CONCAT26(local_658._22_2_,
                                                           CONCAT15(local_658[0x15],
                                                                    CONCAT14(local_658[0x14],
                                                                             local_658._16_4_))) + 1
                                                 );
                                }
                                bVar6 = false;
                                bVar7 = false;
                                bVar28 = true;
                                goto LAB_002270cc;
                              }
                              local_608._1_2_ = 1;
                              local_608[0] = local_528[1];
                              bVar6 = true;
                            }
                            if ((bVar8) || (bVar6)) {
                              nonstd::optional_lite::optional<tinyusdz::Animatable<bool>>::operator=
                                        (aoStack_98,(Animatable<bool> *)local_608);
                            }
                            bVar7 = true;
                            bVar28 = false;
                          }
                          else {
                            ConvertToAnimatable<bool>
                                      ((optional<tinyusdz::Animatable<bool>_> *)local_658,local_310)
                            ;
                            local_528[0] = local_658[0];
                            local_621 = local_658[0];
                            if (local_658[0] == (fmt)0x1) {
                              uStack_51e._0_1_ = local_658[10];
                              local_528._8_2_ = local_658._8_2_;
                              aStack_518._M_allocated_capacity._0_4_ = local_658._16_4_;
                              aStack_518._M_allocated_capacity._4_4_ =
                                   (undefined4)
                                   (CONCAT26(local_658._22_2_,
                                             CONCAT15(local_658[0x15],
                                                      CONCAT14(local_658[0x14],local_658._16_4_)))
                                   >> 0x20);
                              aStack_518._M_local_buf[8] = (char)local_658._24_8_;
                              aStack_518._9_7_ = SUB87(local_658._24_8_,1);
                              bStack_508 = SUB81(local_658._32_8_,0);
                              uStack_507 = SUB87(local_658._32_8_,1);
                              local_500 = local_658[0x28];
                              local_608._0_3_ = (undefined3)local_658._8_8_;
                              ::std::
                              vector<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
                              ::operator=((vector<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
                                           *)(local_608 + 8),
                                          (vector<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
                                           *)&aStack_518);
                              bStack_5e8 = (bool)local_500;
                            }
                            else {
                              local_5d8 = 8;
                              local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
                              ::std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)&local_588,
                                         "Converting timeSamples Attribute data failed for `{}`. Guess TimeSamples have values with different type(expected is `{}`)?"
                                         ,"");
                              local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
                              local_548.field_2._M_allocated_capacity._0_4_ = 0x6c6f6f62;
                              local_548._M_string_length = 4;
                              local_548.field_2._M_allocated_capacity._4_4_ =
                                   local_548.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
                              fmt::format<std::__cxx11::string,std::__cxx11::string>
                                        ((string *)local_658,(fmt *)&local_588,&local_2f8,&local_548
                                         ,err);
                              ::std::__cxx11::string::operator=
                                        ((string *)&local_5d0,(string *)local_658);
                              if ((undefined1 *)local_658._0_8_ != local_658 + 0x10) {
                                operator_delete((void *)local_658._0_8_,
                                                CONCAT26(local_658._22_2_,
                                                         CONCAT15(local_658[0x15],
                                                                  CONCAT14(local_658[0x14],
                                                                           local_658._16_4_))) + 1);
                              }
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_548._M_dataplus._M_p != &local_548.field_2) {
                                operator_delete(local_548._M_dataplus._M_p,
                                                CONCAT44(local_548.field_2._M_allocated_capacity.
                                                         _4_4_,local_548.field_2.
                                                               _M_allocated_capacity._0_4_) + 1);
                              }
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_588._M_dataplus._M_p != &local_588.field_2) {
                                operator_delete(local_588._M_dataplus._M_p,
                                                CONCAT44(local_588.field_2._M_allocated_capacity.
                                                         _4_4_,local_588.field_2.
                                                               _M_allocated_capacity._0_4_) + 1);
                              }
                            }
                            if (((string)local_528[0] == (string)0x1) &&
                               (pvVar18 = (void *)CONCAT44(aStack_518._M_allocated_capacity._4_4_,
                                                           aStack_518._M_allocated_capacity._0_4_),
                               pvVar18 != (void *)0x0)) {
                              operator_delete(pvVar18,CONCAT71(uStack_507,bStack_508) -
                                                      (long)pvVar18);
                            }
                            bVar28 = true;
                            bVar8 = true;
                            bVar6 = false;
                            bVar7 = false;
                            bVar25 = false;
                            if (local_621 != (fmt)0x0) goto LAB_00226efc;
                          }
LAB_002270cc:
                          if ((pointer)local_608._8_8_ != (pointer)0x0) {
                            operator_delete((void *)local_608._8_8_,
                                            CONCAT71(local_608._25_7_,local_608[0x18]) -
                                            local_608._8_8_);
                          }
                          p_Var20 = local_620;
                          if (bVar7) goto LAB_002270f1;
                        }
                        else {
LAB_00226ba3:
                          if (p_Var14[3]._M_color != _S_black) goto LAB_00226cee;
                          bVar28 = primvar::PrimVar::is_timesamples
                                             ((PrimVar *)&p_Var14[4]._M_parent);
                          if (bVar28) {
                            local_5d8 = 4;
                            local_658._0_8_ = local_658 + 0x10;
                            ::std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_658,
                                       "TimeSample value is assigned to `uniform` property `{}","");
                            fmt::format<std::__cxx11::string>
                                      ((string *)local_528,(fmt *)local_658,(string *)p_Var20,
                                       &args->_name);
                            ::std::__cxx11::string::operator=
                                      ((string *)&local_5d0,(string *)local_528);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_528._0_8_ != &aStack_518) {
                              operator_delete((void *)local_528._0_8_,
                                              CONCAT44(aStack_518._M_allocated_capacity._4_4_,
                                                       aStack_518._M_allocated_capacity._0_4_) + 1);
                            }
                            psVar26 = local_610;
                            if ((undefined1 *)local_658._0_8_ != local_658 + 0x10) {
                              operator_delete((void *)local_658._0_8_,
                                              CONCAT26(local_658._22_2_,
                                                       CONCAT15(local_658[0x15],
                                                                CONCAT14(local_658[0x14],
                                                                         local_658._16_4_))) + 1);
                            }
                            goto LAB_0022715e;
                          }
                          primvar::PrimVar::get_value<bool>((PrimVar *)local_528);
                          if ((string)local_528[0] == (string)0x1) {
                            uVar9 = local_528[1];
                            aStack_518._M_local_buf[8] = '\0';
                            aStack_518._9_7_ = 0;
                            bStack_508 = false;
                            stack0xfffffffffffffae0 = (pointer)0x0;
                            aStack_518._M_allocated_capacity._0_4_ = 0;
                            aStack_518._M_allocated_capacity._4_4_ = 0;
                            local_528._1_2_ = 1;
                            local_528[0] = uVar9;
                            nonstd::optional_lite::optional<tinyusdz::Animatable<bool>>::operator=
                                      (aoStack_98,(Animatable<bool> *)local_528);
                            if ((pointer)stack0xfffffffffffffae0 != (pointer)0x0) {
                              operator_delete((void *)stack0xfffffffffffffae0,
                                              CONCAT71(aStack_518._9_7_,aStack_518._M_local_buf[8])
                                              - stack0xfffffffffffffae0);
                            }
                            goto LAB_00226cee;
                          }
                          local_5d8 = 3;
                          local_658._0_8_ = local_658 + 0x10;
                          ::std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_658,
                                     "Fallback. Failed to retrieve value with requested type `{}`.",
                                     "");
                          local_608._0_8_ = local_608 + 0x10;
                          local_608._16_4_ = 0x6c6f6f62;
                          local_608._8_8_ = (pointer)0x4;
                          local_608._20_4_ = local_608._20_4_ & 0xffffff00;
                          fmt::format<std::__cxx11::string>
                                    ((string *)local_528,(fmt *)local_658,(string *)local_608,
                                     &args->_name);
                          ::std::__cxx11::string::operator=
                                    ((string *)&local_5d0,(string *)local_528);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_528._0_8_ != &aStack_518) {
                            operator_delete((void *)local_528._0_8_,
                                            CONCAT44(aStack_518._M_allocated_capacity._4_4_,
                                                     aStack_518._M_allocated_capacity._0_4_) + 1);
                          }
                          if ((undefined1 *)local_608._0_8_ != local_608 + 0x10) {
                            operator_delete((void *)local_608._0_8_,
                                            CONCAT44(local_608._20_4_,local_608._16_4_) + 1);
                          }
                          if ((undefined1 *)local_658._0_8_ != local_658 + 0x10) {
                            operator_delete((void *)local_658._0_8_,
                                            CONCAT26(local_658._22_2_,
                                                     CONCAT15(local_658[0x15],
                                                              CONCAT14(local_658[0x14],
                                                                       local_658._16_4_))) + 1);
                          }
                          bVar28 = true;
                        }
                        p_Var20 = local_620;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_398._M_dataplus._M_p != &local_398.field_2) {
                          operator_delete(local_398._M_dataplus._M_p,
                                          local_398.field_2._M_allocated_capacity + 1);
                        }
                        psVar26 = local_610;
                        if ((bVar28) ||
                           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_5d0._M_dataplus._M_p == &local_5d0.field_2)) goto LAB_00227183;
                        uVar23 = CONCAT71(local_5d0.field_2._M_allocated_capacity._1_7_,
                                          local_5d0.field_2._M_local_buf[0]);
                        _Var24._M_p = local_5d0._M_dataplus._M_p;
                        goto LAB_0022717b;
                      }
                      if (iVar10 == 0) {
                        local_68 = true;
                        AttrMetas::operator=((AttrMetas *)local_2b8,(AttrMetas *)(p_Var14 + 7));
                        ::std::
                        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        ::_M_insert_unique<std::__cxx11::string_const&>
                                  (local_618,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)p_Var20);
                        local_5d8 = 0;
                        goto LAB_0022715e;
                      }
                      bVar6 = false;
                      bVar25 = false;
LAB_002270f1:
                      if (local_308 == local_5e0) {
                        if ((!bVar25) && (!bVar6)) {
                          ::std::__cxx11::string::operator=
                                    ((string *)&local_5d0,"Invalid Property type(internal error)");
                          local_5d8 = 8;
                          psVar26 = local_610;
                          goto LAB_0022715e;
                        }
                      }
                      else if ((!bVar25) && (!bVar6)) {
                        local_68 = true;
                      }
                      AttrMetas::operator=((AttrMetas *)local_2b8,(AttrMetas *)(p_Var14 + 7));
                      ::std::
                      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      ::_M_insert_unique<std::__cxx11::string_const&>
                                (local_618,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)p_Var20);
                      local_5d8 = 0;
                      psVar26 = local_610;
                    }
                    else {
LAB_0022697d:
                      local_5d8 = 3;
                      ::std::__cxx11::stringstream::stringstream((stringstream *)local_528);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)aStack_518._M_local_buf,"Property type mismatch. ",0x18)
                      ;
                      poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)aStack_518._M_local_buf,
                                           *(char **)(p_Var14 + 1),(long)p_Var14[1]._M_parent);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                (poVar16," expects type `",0xf);
                      paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)(local_658 + 0x10);
                      local_658._16_4_ = 0x6c6f6f62;
                      local_658._8_8_ = (anon_struct_8_0_00000001_for___align)0x4;
                      local_658[0x14] = '\0';
                      local_658._0_8_ = paVar2;
                      poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                                          (poVar16,paVar2->_M_local_buf,4);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                (poVar16,"` but defined as type `",0x17);
                      poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                                          (poVar16,local_398._M_dataplus._M_p,
                                           local_398._M_string_length);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"`",1);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_658._0_8_ != paVar2) {
                        operator_delete((void *)local_658._0_8_,
                                        CONCAT26(local_658._22_2_,
                                                 CONCAT15(local_658[0x15],
                                                          CONCAT14(local_658[0x14],local_658._16_4_)
                                                         )) + 1);
                      }
                      ::std::__cxx11::stringbuf::str();
                      ::std::__cxx11::string::operator=((string *)&local_5d0,(string *)local_658);
                      psVar26 = local_610;
                      if ((undefined1 *)local_658._0_8_ != local_658 + 0x10) {
                        operator_delete((void *)local_658._0_8_,
                                        CONCAT26(local_658._22_2_,
                                                 CONCAT15(local_658[0x15],
                                                          CONCAT14(local_658[0x14],local_658._16_4_)
                                                         )) + 1);
                      }
                      ::std::__cxx11::stringstream::~stringstream((stringstream *)local_528);
                      ::std::ios_base::~ios_base(local_4a8);
                    }
LAB_0022715e:
                    uVar23 = local_398.field_2._M_allocated_capacity;
                    _Var24._M_p = local_398._M_dataplus._M_p;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_398._M_dataplus._M_p == &local_398.field_2) goto LAB_00227183;
                  }
LAB_0022717b:
                  operator_delete(_Var24._M_p,uVar23 + 1);
                }
                else {
                  local_5d8 = 1;
                }
LAB_00227183:
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
                  operator_delete(local_2f8._M_dataplus._M_p,
                                  local_2f8.field_2._M_allocated_capacity + 1);
                }
                local_5e0 = (Attribute *)CONCAT44(local_5e0._4_4_,local_5d8);
                if (2 < local_5d8) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_528);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_528,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_528,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_528,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_528,"ReconstructCollectionProperties",0x1f);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_528,"():",3)
                  ;
                  poVar16 = (ostream *)::std::ostream::operator<<((ostringstream *)local_528,0xa8d);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
                  local_608._0_8_ = local_608 + 0x10;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_608,"Parsing attribute `{}` failed. Error: {}","");
                  p_Var20 = local_620;
                  fmt::format<std::__cxx11::string,std::__cxx11::string>
                            ((string *)local_658,(fmt *)local_608,(string *)local_620,&local_5d0,err
                            );
                  poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_528,(char *)local_658._0_8_,local_658._8_8_)
                  ;
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
                  if ((undefined1 *)local_658._0_8_ != local_658 + 0x10) {
                    operator_delete((void *)local_658._0_8_,
                                    CONCAT26(local_658._22_2_,
                                             CONCAT15(local_658[0x15],
                                                      CONCAT14(local_658[0x14],local_658._16_4_))) +
                                    1);
                  }
                  if ((undefined1 *)local_608._0_8_ != local_608 + 0x10) {
                    operator_delete((void *)local_608._0_8_,
                                    CONCAT44(local_608._20_4_,local_608._16_4_) + 1);
                  }
                  if (psVar26 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_658,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_608,psVar26);
                    ::std::__cxx11::string::operator=((string *)psVar26,(string *)local_658);
                    if ((undefined1 *)local_658._0_8_ != local_658 + 0x10) {
                      operator_delete((void *)local_658._0_8_,
                                      CONCAT26(local_658._22_2_,
                                               CONCAT15(local_658[0x15],
                                                        CONCAT14(local_658[0x14],local_658._16_4_)))
                                      + 1);
                    }
                    p_Var20 = local_620;
                    if ((undefined1 *)local_608._0_8_ != local_608 + 0x10) {
                      operator_delete((void *)local_608._0_8_,
                                      CONCAT44(local_608._20_4_,local_608._16_4_) + 1);
                      p_Var20 = local_620;
                    }
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_528);
                  ::std::ios_base::~ios_base(local_4b8);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
                  operator_delete(local_5d0._M_dataplus._M_p,
                                  CONCAT71(local_5d0.field_2._M_allocated_capacity._1_7_,
                                           local_5d0.field_2._M_local_buf[0]) + 1);
                }
                uVar3 = (uint)local_5e0;
                if (((uint)local_5e0 < 3) &&
                   (cVar11 = ::std::
                             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_618,(key_type *)p_Var20), cVar11._M_node != local_598))
                {
                  pCVar13 = ordered_dict<tinyusdz::CollectionInstance>::get_or_add
                                      (local_5a8,(string *)local_358);
                  TypedAttributeWithFallback<tinyusdz::Animatable<bool>_>::operator=
                            (&pCVar13->includeRoot,
                             (TypedAttributeWithFallback<tinyusdz::Animatable<bool>_> *)local_2b8);
                }
                if (local_58 != (pointer)0x0) {
                  operator_delete(local_58,(long)local_48 - (long)local_58);
                }
                if ((aoStack_98[0] == (optional<tinyusdz::Animatable<bool>>)0x1) &&
                   (pvVar18 = (void *)CONCAT71(local_90._9_7_,local_90._8_1_),
                   pvVar18 != (void *)0x0)) {
                  operator_delete(pvVar18,local_90._24_8_ - (long)pvVar18);
                }
                cVar27 = 2 < uVar3;
              }
LAB_0022743f:
              ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                        ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_5a0);
              AttrMetas::~AttrMetas((AttrMetas *)local_2b8);
            }
LAB_00227459:
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358._0_8_
                != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_358 + 0x10)) {
              operator_delete((void *)local_358._0_8_,local_358._16_8_ + 1);
            }
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2b8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2b8,"ReconstructCollectionProperties",0x1f);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b8,"():",3);
            poVar16 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2b8,0xa6a);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
            local_658._0_8_ = local_658 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_658,
                       "Invalid collection property name. Must be \'collection:INSTANCE_NAME:<prop_name>\' but got \'{}\'"
                       ,"");
            fmt::format<std::__cxx11::string>
                      ((string *)local_528,(fmt *)local_658,(string *)local_620,pbVar17);
            poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2b8,(char *)local_528._0_8_,
                                 stack0xfffffffffffffae0);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_528._0_8_ != &aStack_518) {
              operator_delete((void *)local_528._0_8_,
                              CONCAT44(aStack_518._M_allocated_capacity._4_4_,
                                       aStack_518._M_allocated_capacity._0_4_) + 1);
            }
            if ((undefined1 *)local_658._0_8_ != local_658 + 0x10) {
              operator_delete((void *)local_658._0_8_,
                              CONCAT26(local_658._22_2_,
                                       CONCAT15(local_658[0x15],
                                                CONCAT14(local_658[0x14],local_658._16_4_))) + 1);
            }
            if (psVar26 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
            {
              ::std::__cxx11::stringbuf::str();
              plVar15 = (long *)::std::__cxx11::string::_M_append
                                          (local_658,(ulong)(psVar26->_M_dataplus)._M_p);
LAB_00225ce7:
              paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(plVar15 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar15 == paVar1) {
                aStack_518._M_allocated_capacity._0_4_ = (undefined4)paVar1->_M_allocated_capacity;
                aStack_518._M_allocated_capacity._4_4_ =
                     (undefined4)(paVar1->_M_allocated_capacity >> 0x20);
                aStack_518._M_local_buf[8] = (char)plVar15[3];
                aStack_518._9_7_ = (undefined7)((ulong)plVar15[3] >> 8);
                local_528._0_8_ = &aStack_518;
              }
              else {
                aStack_518._M_allocated_capacity._0_4_ = (undefined4)paVar1->_M_allocated_capacity;
                aStack_518._M_allocated_capacity._4_4_ =
                     (undefined4)(paVar1->_M_allocated_capacity >> 0x20);
                local_528._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)*plVar15;
              }
              unique0x00012000 = plVar15[1];
              *plVar15 = (long)paVar1;
              plVar15[1] = 0;
              *(undefined1 *)(plVar15 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)psVar26,(string *)local_528);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_528._0_8_ != &aStack_518) {
                operator_delete((void *)local_528._0_8_,
                                CONCAT44(aStack_518._M_allocated_capacity._4_4_,
                                         aStack_518._M_allocated_capacity._0_4_) + 1);
              }
              if ((undefined1 *)local_658._0_8_ != local_658 + 0x10) {
                operator_delete((void *)local_658._0_8_,
                                CONCAT26(local_658._22_2_,
                                         CONCAT15(local_658[0x15],
                                                  CONCAT14(local_658[0x14],local_658._16_4_))) + 1);
              }
            }
LAB_00225d7c:
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b8);
            ::std::ios_base::~ios_base((ios_base *)(local_260 + 0x18));
            cVar27 = '\x01';
          }
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_568);
          if (local_2d8[0] != local_2c8) {
            operator_delete(local_2d8[0],local_2c8[0] + 1);
          }
          if ((cVar27 != '\x03') && (cVar27 != '\0')) {
            bVar28 = false;
            goto LAB_002275e7;
          }
        }
        p_Var14 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var14);
      } while (p_Var14 != local_300);
      bVar28 = true;
LAB_002275e7:
      if (local_368 == (code *)0x0) {
        return bVar28;
      }
    }
  }
  (*local_368)(&local_378,&local_378,3);
  return bVar28;
}

Assistant:

bool ReconstructCollectionProperties(
  std::set<std::string> &table, /* inout */
  const std::map<std::string, Property> &properties,
  Collection *coll, /* inout */
  std::string *warn,
  std::string *err,
  bool strict_allowedToken_check)
{
  constexpr auto kCollectionPrefix = "collection:";

  std::function<nonstd::expected<CollectionInstance::ExpansionRule, std::string>(const std::string &)> ExpansionRuleEnumHandler = [](const std::string &tok) {
  //auto ExpansionRuleEnumHandler = [](const std::string &tok) {
    using EnumTy = std::pair<CollectionInstance::ExpansionRule, const char *>;
    const std::vector<EnumTy> enums = {
        std::make_pair(CollectionInstance::ExpansionRule::ExplicitOnly, kExplicitOnly),
        std::make_pair(CollectionInstance::ExpansionRule::ExpandPrims, kExpandPrims),
        std::make_pair(CollectionInstance::ExpansionRule::ExpandPrimsAndProperties, kExpandPrimsAndProperties),
    };
    return EnumHandler<CollectionInstance::ExpansionRule>("expansionRule", tok, enums);
  };

  if (!coll) {
    return false;
  }

  for (const auto &prop : properties) {
    if (startsWith(prop.first, kCollectionPrefix)) {
      if (table.count(prop.first)) {
         continue;
      }

      std::string suffix = removePrefix(prop.first, kCollectionPrefix);
      std::vector<std::string> names = split(suffix, ":");
      if (names.size() != 2) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid collection property name. Must be 'collection:INSTANCE_NAME:<prop_name>' but got '{}'",  prop.first));
      }
      if (names[0].empty()) {
        PUSH_ERROR_AND_RETURN("INSTANCE_NAME is empty for collection property name");
      }
      if (names[1].empty()) {
        PUSH_ERROR_AND_RETURN("Collection property name is empty");
      }

      std::string instance_name = names[0];

      if (names[1] == "includes") {

        if (!prop.second.is_relationship()) {
          PUSH_ERROR_AND_RETURN(fmt::format("`{}` must be a Relationship", prop.first));
        }

        CollectionInstance &coll_instance = coll->get_or_add_instance(instance_name);
        coll_instance.includes = prop.second.get_relationship();
        table.insert(prop.first);

      } else if (names[1] == "expansionRule") {

        TypedAttributeWithFallback<CollectionInstance::ExpansionRule> r{CollectionInstance::ExpansionRule::ExpandPrims};

        PARSE_UNIFORM_ENUM_PROPERTY(table, prop, prop.first, CollectionInstance::ExpansionRule, ExpansionRuleEnumHandler, CollectionInstance,
                       r, strict_allowedToken_check)

        if (table.count(prop.first)) {
          CollectionInstance &coll_instance = coll->get_or_add_instance(instance_name);
          coll_instance.expansionRule = r.get_value();
        }
      } else if (names[1] == "includeRoot") {

        TypedAttributeWithFallback<Animatable<bool>> includeRoot{false};
        PARSE_TYPED_ATTRIBUTE_NOCONTINUE(table, prop, prop.first, CollectionInstance, includeRoot)

        if (table.count(prop.first)) {
          CollectionInstance &coll_instance = coll->get_or_add_instance(instance_name);
          coll_instance.includeRoot = includeRoot;
        }
      } else if (names[1] == "excludes") {

        if (!prop.second.is_relationship()) {
          PUSH_ERROR_AND_RETURN(fmt::format("`{}` must be a Relationship", prop.first));
        }

        CollectionInstance &coll_instance = coll->get_or_add_instance(instance_name);
        coll_instance.excludes = prop.second.get_relationship();
        table.insert(prop.first);

      }
    }
  }

  return true;
}